

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_12::NameApplier::OnBrTableExpr(NameApplier *this,BrTableExpr *expr)

{
  bool bVar1;
  reference var;
  string_view sVar2;
  string_view label;
  string_view label_1;
  Var *target;
  iterator __end2;
  iterator __begin2;
  VarVector *__range2;
  BrTableExpr *expr_local;
  NameApplier *this_local;
  
  __end2 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&expr->targets);
  target = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&expr->targets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                *)&target);
    if (!bVar1) break;
    var = __gnu_cxx::
          __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
          operator*(&__end2);
    sVar2 = FindLabelByVar(this,var);
    UseNameForVar(this,sVar2,var);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end2);
  }
  sVar2 = FindLabelByVar(this,&expr->default_target);
  UseNameForVar(this,sVar2,&expr->default_target);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::OnBrTableExpr(BrTableExpr* expr) {
  for (Var& target : expr->targets) {
    std::string_view label = FindLabelByVar(&target);
    UseNameForVar(label, &target);
  }

  std::string_view label = FindLabelByVar(&expr->default_target);
  UseNameForVar(label, &expr->default_target);
  return Result::Ok;
}